

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O1

void on_read(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  uv_loop_t *loop;
  uv_timer_t *loop_00;
  int extraout_EDX;
  char *pcVar6;
  char *pcVar7;
  void *unaff_RBP;
  int iVar8;
  uv_stream_t *handle;
  uv_process_t *puVar9;
  uv_timer_t *puVar10;
  code *pcVar11;
  uv_process_options_t *unaff_R14;
  undefined8 unaff_R15;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uv_os_fd_t uStackY_e74;
  sockaddr_in sStackY_e70;
  uv_stdio_container_t uStackY_e60;
  undefined4 uStackY_e50;
  undefined4 uStackY_e48;
  undefined4 uStackY_e40;
  undefined4 uStackY_e38;
  undefined4 uStackY_e30;
  int iStackY_e28;
  uv_loop_t *puStackY_e20;
  uv_tcp_t uStackY_e18;
  uv_stdio_container_t uStackY_d20;
  undefined4 uStackY_d10;
  undefined4 uStackY_d00;
  undefined4 uStackY_cf0;
  uv_loop_t *puStackY_ce8;
  undefined1 auStackY_cd8 [272];
  anon_union_8_2_26168aa3_for_data aStackY_bc8;
  code *pcStackY_bc0;
  code *pcStackY_bb8;
  void *pvStackY_bb0;
  undefined1 auStackY_ba8 [40];
  uv_stdio_container_t uStackY_b80;
  int iStackY_b70;
  uv_handle_type *puStackY_b68;
  uv_stream_t uStackY_b60;
  uv_handle_type auStackY_a58 [114];
  uv_loop_t *puStackY_890;
  uv_fs_t *puStackY_888;
  code *pcStackY_880;
  uv_buf_t uStack_870;
  uv_fs_t uStack_860;
  uv_stdio_container_t uStack_6a8;
  undefined4 uStack_698;
  uint uStack_690;
  undefined4 uStack_688;
  uint uStack_680;
  uv_loop_t *puStack_670;
  uv_fs_t *puStack_668;
  uv_buf_t uStack_640;
  uv_stdio_container_t uStack_630;
  undefined4 uStack_620;
  uint uStack_618;
  undefined4 uStack_610;
  uint uStack_608;
  uv_fs_t uStack_5f8;
  uv_loop_t *puStack_440;
  uv_fs_t *puStack_438;
  uv_buf_t uStack_418;
  uv_stdio_container_t uStack_408;
  undefined4 uStack_3f8;
  uint uStack_3f0;
  undefined4 uStack_3e8;
  uint uStack_3e0;
  uv_fs_t uStack_3d8;
  uv_loop_t *puStack_220;
  uv_fs_t *puStack_218;
  uv_buf_t uStack_200;
  uv_stdio_container_t uStack_1f0;
  undefined4 uStack_1e0;
  uint uStack_1d8;
  uv_fs_t uStack_1d0;
  
  if (0 < nread) {
    output_used = output_used + (int)nread;
    return;
  }
  if (-1 < nread) {
    return;
  }
  if (nread == -0xfff) {
    uv_close((uv_handle_t *)tcp,close_cb);
    return;
  }
  on_read_cold_1();
  pcVar6 = "stdout_file";
  puStack_218 = (uv_fs_t *)0x16a01d;
  unlink("stdout_file");
  puStack_218 = (uv_fs_t *)0x16a030;
  init_process_options("spawn_helper2",exit_cb);
  puStack_218 = (uv_fs_t *)0x16a04d;
  uVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_1d0,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  if (uVar1 == 0xffffffff) {
    puStack_218 = (uv_fs_t *)0x16a1dc;
    run_test_spawn_stdout_to_file_cold_9();
LAB_0016a1dc:
    puStack_218 = (uv_fs_t *)0x16a1e1;
    run_test_spawn_stdout_to_file_cold_1();
LAB_0016a1e1:
    puStack_218 = (uv_fs_t *)0x16a1e6;
    run_test_spawn_stdout_to_file_cold_2();
LAB_0016a1e6:
    puStack_218 = (uv_fs_t *)0x16a1eb;
    run_test_spawn_stdout_to_file_cold_3();
LAB_0016a1eb:
    puStack_218 = (uv_fs_t *)0x16a1f0;
    run_test_spawn_stdout_to_file_cold_4();
LAB_0016a1f0:
    puStack_218 = (uv_fs_t *)0x16a1f5;
    run_test_spawn_stdout_to_file_cold_5();
LAB_0016a1f5:
    puStack_218 = (uv_fs_t *)0x16a1fa;
    run_test_spawn_stdout_to_file_cold_6();
LAB_0016a1fa:
    puStack_218 = (uv_fs_t *)0x16a1ff;
    run_test_spawn_stdout_to_file_cold_7();
  }
  else {
    pcVar6 = (char *)(ulong)uVar1;
    puStack_218 = (uv_fs_t *)0x16a062;
    uv_fs_req_cleanup(&uStack_1d0);
    options.stdio = &uStack_1f0;
    unaff_R14 = &options;
    uStack_1f0.flags = UV_IGNORE;
    uStack_1e0 = 2;
    options.stdio_count = 2;
    puStack_218 = (uv_fs_t *)0x16a091;
    uStack_1d8 = uVar1;
    puVar4 = uv_default_loop();
    puStack_218 = (uv_fs_t *)0x16a0a3;
    iVar2 = uv_spawn(puVar4,&process,&options);
    if (iVar2 != 0) goto LAB_0016a1dc;
    puStack_218 = (uv_fs_t *)0x16a0b0;
    puVar4 = uv_default_loop();
    puStack_218 = (uv_fs_t *)0x16a0ba;
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016a1e1;
    if (exit_cb_called != 1) goto LAB_0016a1e6;
    if (close_cb_called != 1) goto LAB_0016a1eb;
    puStack_218 = (uv_fs_t *)0x16a0ed;
    uStack_200 = uv_buf_init(output,0x400);
    puStack_218 = (uv_fs_t *)0x16a118;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&uStack_1d0,uVar1,&uStack_200,1,0,(uv_fs_cb)0x0);
    if (iVar2 != 0xc) goto LAB_0016a1f0;
    unaff_R14 = (uv_process_options_t *)&uStack_1d0;
    puStack_218 = (uv_fs_t *)0x16a12e;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    puStack_218 = (uv_fs_t *)0x16a13c;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar1,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0016a1f5;
    puStack_218 = (uv_fs_t *)0x16a14e;
    uv_fs_req_cleanup(&uStack_1d0);
    puStack_218 = (uv_fs_t *)0x16a163;
    printf("output is: %s",output);
    if (CONCAT17(output[0xc],
                 CONCAT16(output[0xb],
                          CONCAT15(output[10],
                                   CONCAT14(output[9],
                                            CONCAT13(output[8],
                                                     CONCAT12(output[7],
                                                              CONCAT11(output[6],output[5]))))))) !=
        0xa646c726f7720 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x6f77206f6c6c6568) goto LAB_0016a1fa;
    puStack_218 = (uv_fs_t *)0x16a196;
    unlink("stdout_file");
    puStack_218 = (uv_fs_t *)0x16a19b;
    pcVar6 = (char *)uv_default_loop();
    puStack_218 = (uv_fs_t *)0x16a1af;
    uv_walk((uv_loop_t *)pcVar6,close_walk_cb,(void *)0x0);
    puStack_218 = (uv_fs_t *)0x16a1b9;
    uv_run((uv_loop_t *)pcVar6,UV_RUN_DEFAULT);
    puStack_218 = (uv_fs_t *)0x16a1be;
    puVar4 = uv_default_loop();
    puStack_218 = (uv_fs_t *)0x16a1c6;
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return;
    }
  }
  puStack_218 = (uv_fs_t *)run_test_spawn_stdout_and_stderr_to_file;
  run_test_spawn_stdout_to_file_cold_8();
  pcVar7 = "stdout_file";
  puStack_220 = (uv_loop_t *)pcVar6;
  puStack_218 = (uv_fs_t *)unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  uVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_3d8,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  if (uVar1 == 0xffffffff) {
    run_test_spawn_stdout_and_stderr_to_file_cold_9();
LAB_0016a3ee:
    run_test_spawn_stdout_and_stderr_to_file_cold_1();
LAB_0016a3f3:
    run_test_spawn_stdout_and_stderr_to_file_cold_2();
LAB_0016a3f8:
    run_test_spawn_stdout_and_stderr_to_file_cold_3();
LAB_0016a3fd:
    run_test_spawn_stdout_and_stderr_to_file_cold_4();
LAB_0016a402:
    run_test_spawn_stdout_and_stderr_to_file_cold_5();
LAB_0016a407:
    run_test_spawn_stdout_and_stderr_to_file_cold_6();
LAB_0016a40c:
    run_test_spawn_stdout_and_stderr_to_file_cold_7();
  }
  else {
    pcVar7 = (char *)(ulong)uVar1;
    uv_fs_req_cleanup(&uStack_3d8);
    options.stdio = &uStack_408;
    unaff_R14 = &options;
    uStack_408.flags = UV_IGNORE;
    uStack_3f8 = 2;
    uStack_3e8 = 2;
    options.stdio_count = 3;
    uStack_3f0 = uVar1;
    uStack_3e0 = uVar1;
    puVar4 = uv_default_loop();
    iVar2 = uv_spawn(puVar4,&process,&options);
    if (iVar2 != 0) goto LAB_0016a3ee;
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016a3f3;
    if (exit_cb_called != 1) goto LAB_0016a3f8;
    if (close_cb_called != 1) goto LAB_0016a3fd;
    uStack_418 = uv_buf_init(output,0x400);
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&uStack_3d8,uVar1,&uStack_418,1,0,(uv_fs_cb)0x0);
    if (iVar2 != 0x1b) goto LAB_0016a402;
    unaff_R14 = (uv_process_options_t *)&uStack_3d8;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar1,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0016a407;
    uv_fs_req_cleanup(&uStack_3d8);
    printf("output is: %s",output);
    auVar14[0] = -(output[0xc] == 'h');
    auVar14[1] = -(output[0xd] == 'e');
    auVar14[2] = -(output[0xe] == 'l');
    auVar14[3] = -(output[0xf] == 'l');
    auVar14[4] = -(output[0x10] == 'o');
    auVar14[5] = -(output[0x11] == ' ');
    auVar14[6] = -(output[0x12] == 'e');
    auVar14[7] = -(output[0x13] == 'r');
    auVar14[8] = -(output[0x14] == 'r');
    auVar14[9] = -(output[0x15] == 'w');
    auVar14[10] = -(output[0x16] == 'o');
    auVar14[0xb] = -(output[0x17] == 'r');
    auVar14[0xc] = -(output[0x18] == 'l');
    auVar14[0xd] = -(output[0x19] == 'd');
    auVar14[0xe] = -(output[0x1a] == '\n');
    auVar14[0xf] = -(output[0x1b] == '\0');
    auVar12[0] = -(output[0] == 'h');
    auVar12[1] = -(output[1] == 'e');
    auVar12[2] = -(output[2] == 'l');
    auVar12[3] = -(output[3] == 'l');
    auVar12[4] = -(output[4] == 'o');
    auVar12[5] = -(output[5] == ' ');
    auVar12[6] = -(output[6] == 'w');
    auVar12[7] = -(output[7] == 'o');
    auVar12[8] = -(output[8] == 'r');
    auVar12[9] = -(output[9] == 'l');
    auVar12[10] = -(output[10] == 'd');
    auVar12[0xb] = -(output[0xb] == '\n');
    auVar12[0xc] = -(output[0xc] == 'h');
    auVar12[0xd] = -(output[0xd] == 'e');
    auVar12[0xe] = -(output[0xe] == 'l');
    auVar12[0xf] = -(output[0xf] == 'l');
    auVar12 = auVar12 & auVar14;
    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0016a40c;
    unlink("stdout_file");
    pcVar7 = (char *)uv_default_loop();
    uv_walk((uv_loop_t *)pcVar7,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)pcVar7,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return;
    }
  }
  run_test_spawn_stdout_and_stderr_to_file_cold_8();
  pcVar6 = "stdout_file";
  puStack_440 = (uv_loop_t *)pcVar7;
  puStack_438 = (uv_fs_t *)unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  uVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_5f8,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  if (uVar1 == 0xffffffff) {
    run_test_spawn_stdout_and_stderr_to_file2_cold_10();
LAB_0016a619:
    run_test_spawn_stdout_and_stderr_to_file2_cold_9();
LAB_0016a61e:
    run_test_spawn_stdout_and_stderr_to_file2_cold_1();
LAB_0016a623:
    run_test_spawn_stdout_and_stderr_to_file2_cold_2();
LAB_0016a628:
    run_test_spawn_stdout_and_stderr_to_file2_cold_3();
LAB_0016a62d:
    run_test_spawn_stdout_and_stderr_to_file2_cold_4();
LAB_0016a632:
    run_test_spawn_stdout_and_stderr_to_file2_cold_5();
LAB_0016a637:
    run_test_spawn_stdout_and_stderr_to_file2_cold_6();
LAB_0016a63c:
    run_test_spawn_stdout_and_stderr_to_file2_cold_7();
  }
  else {
    pcVar6 = (char *)(ulong)uVar1;
    uv_fs_req_cleanup(&uStack_5f8);
    unaff_RBP = (void *)0x2;
    uVar1 = dup2(uVar1,2);
    if (uVar1 == 0xffffffff) goto LAB_0016a619;
    pcVar6 = (char *)(ulong)uVar1;
    options.stdio = &uStack_630;
    unaff_R14 = &options;
    uStack_630.flags = UV_IGNORE;
    uStack_620 = 2;
    uStack_610 = 2;
    options.stdio_count = 3;
    uStack_618 = uVar1;
    uStack_608 = uVar1;
    puVar4 = uv_default_loop();
    iVar2 = uv_spawn(puVar4,&process,&options);
    if (iVar2 != 0) goto LAB_0016a61e;
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016a623;
    if (exit_cb_called != 1) goto LAB_0016a628;
    if (close_cb_called != 1) goto LAB_0016a62d;
    uStack_640 = uv_buf_init(output,0x400);
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&uStack_5f8,uVar1,&uStack_640,1,0,(uv_fs_cb)0x0);
    if (iVar2 != 0x1b) goto LAB_0016a632;
    unaff_R14 = (uv_process_options_t *)&uStack_5f8;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar1,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0016a637;
    uv_fs_req_cleanup(&uStack_5f8);
    printf("output is: %s",output);
    auVar15[0] = -(output[0xc] == 'h');
    auVar15[1] = -(output[0xd] == 'e');
    auVar15[2] = -(output[0xe] == 'l');
    auVar15[3] = -(output[0xf] == 'l');
    auVar15[4] = -(output[0x10] == 'o');
    auVar15[5] = -(output[0x11] == ' ');
    auVar15[6] = -(output[0x12] == 'e');
    auVar15[7] = -(output[0x13] == 'r');
    auVar15[8] = -(output[0x14] == 'r');
    auVar15[9] = -(output[0x15] == 'w');
    auVar15[10] = -(output[0x16] == 'o');
    auVar15[0xb] = -(output[0x17] == 'r');
    auVar15[0xc] = -(output[0x18] == 'l');
    auVar15[0xd] = -(output[0x19] == 'd');
    auVar15[0xe] = -(output[0x1a] == '\n');
    auVar15[0xf] = -(output[0x1b] == '\0');
    auVar13[0] = -(output[0] == 'h');
    auVar13[1] = -(output[1] == 'e');
    auVar13[2] = -(output[2] == 'l');
    auVar13[3] = -(output[3] == 'l');
    auVar13[4] = -(output[4] == 'o');
    auVar13[5] = -(output[5] == ' ');
    auVar13[6] = -(output[6] == 'w');
    auVar13[7] = -(output[7] == 'o');
    auVar13[8] = -(output[8] == 'r');
    auVar13[9] = -(output[9] == 'l');
    auVar13[10] = -(output[10] == 'd');
    auVar13[0xb] = -(output[0xb] == '\n');
    auVar13[0xc] = -(output[0xc] == 'h');
    auVar13[0xd] = -(output[0xd] == 'e');
    auVar13[0xe] = -(output[0xe] == 'l');
    auVar13[0xf] = -(output[0xf] == 'l');
    auVar13 = auVar13 & auVar15;
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0016a63c;
    unlink("stdout_file");
    pcVar6 = (char *)uv_default_loop();
    uv_walk((uv_loop_t *)pcVar6,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)pcVar6,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return;
    }
  }
  run_test_spawn_stdout_and_stderr_to_file2_cold_8();
  pcVar7 = "stdout_file";
  pcStackY_880 = (code *)0x16a662;
  puStack_670 = (uv_loop_t *)pcVar6;
  puStack_668 = (uv_fs_t *)unaff_R14;
  unlink("stdout_file");
  pcStackY_880 = (code *)0x16a66e;
  unlink("stderr_file");
  pcStackY_880 = (code *)0x16a681;
  init_process_options("spawn_helper6",exit_cb);
  pcStackY_880 = (code *)0x16a69e;
  uVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_860,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  if (uVar1 == 0xffffffff) {
    pcStackY_880 = (code *)0x16a94a;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_15();
LAB_0016a94a:
    pcStackY_880 = (code *)0x16a94f;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_14();
LAB_0016a94f:
    pcStackY_880 = (code *)0x16a954;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_13();
LAB_0016a954:
    pcStackY_880 = (code *)0x16a959;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_12();
LAB_0016a959:
    pcStackY_880 = (code *)0x16a95e;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_1();
LAB_0016a95e:
    pcStackY_880 = (code *)0x16a963;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_2();
LAB_0016a963:
    pcStackY_880 = (code *)0x16a968;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_3();
LAB_0016a968:
    pcStackY_880 = (code *)0x16a96d;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_4();
LAB_0016a96d:
    pcStackY_880 = (code *)0x16a972;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_5();
LAB_0016a972:
    pcStackY_880 = (code *)0x16a977;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_6();
LAB_0016a977:
    pcStackY_880 = (code *)0x16a97c;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_7();
LAB_0016a97c:
    pcStackY_880 = (code *)0x16a981;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_8();
LAB_0016a981:
    pcStackY_880 = (code *)0x16a986;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_9();
LAB_0016a986:
    pcStackY_880 = (code *)0x16a98b;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_10();
  }
  else {
    pcVar7 = (char *)(ulong)uVar1;
    pcStackY_880 = (code *)0x16a6b3;
    uv_fs_req_cleanup(&uStack_860);
    pcStackY_880 = (code *)0x16a6bf;
    uVar1 = dup2(uVar1,1);
    if (uVar1 == 0xffffffff) goto LAB_0016a94a;
    unaff_RBP = (void *)(ulong)uVar1;
    pcStackY_880 = (code *)0x16a6eb;
    uVar3 = uv_fs_open((uv_loop_t *)0x0,&uStack_860,"stderr_file",0x42,0x180,(uv_fs_cb)0x0);
    if (uVar3 == 0xffffffff) goto LAB_0016a94f;
    pcVar7 = (char *)(ulong)uVar3;
    pcStackY_880 = (code *)0x16a700;
    uv_fs_req_cleanup(&uStack_860);
    unaff_R15._0_4_ = 2;
    unaff_R15._4_4_ = 0;
    pcStackY_880 = (code *)0x16a712;
    uVar3 = dup2(uVar3,2);
    if (uVar3 == 0xffffffff) goto LAB_0016a954;
    pcVar7 = (char *)(ulong)uVar3;
    options.stdio = &uStack_6a8;
    unaff_R14 = &options;
    uStack_6a8.flags = UV_IGNORE;
    uStack_698 = 2;
    uStack_688 = 2;
    options.stdio_count = 3;
    pcStackY_880 = (code *)0x16a756;
    uStack_690 = uVar3;
    uStack_680 = uVar1;
    puVar4 = uv_default_loop();
    pcStackY_880 = (code *)0x16a768;
    iVar2 = uv_spawn(puVar4,&process,&options);
    if (iVar2 != 0) goto LAB_0016a959;
    pcStackY_880 = (code *)0x16a775;
    puVar4 = uv_default_loop();
    pcStackY_880 = (code *)0x16a77f;
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016a95e;
    if (exit_cb_called != 1) goto LAB_0016a963;
    if (close_cb_called != 1) goto LAB_0016a968;
    pcStackY_880 = (code *)0x16a7b2;
    uStack_870 = uv_buf_init(output,0x400);
    pcStackY_880 = (code *)0x16a7dd;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&uStack_860,uVar1,&uStack_870,1,0,(uv_fs_cb)0x0);
    if (iVar2 < 0xf) goto LAB_0016a96d;
    unaff_R14 = (uv_process_options_t *)&uStack_860;
    pcStackY_880 = (code *)0x16a7f3;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    pcStackY_880 = (code *)0x16a801;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar1,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0016a972;
    pcStackY_880 = (code *)0x16a813;
    uv_fs_req_cleanup(&uStack_860);
    pcStackY_880 = (code *)0x16a828;
    printf("output is: %s",output);
    if (CONCAT17(output[0xe],
                 CONCAT16(output[0xd],
                          CONCAT15(output[0xc],
                                   CONCAT14(output[0xb],
                                            CONCAT13(output[10],
                                                     CONCAT12(output[9],
                                                              CONCAT11(output[8],output[7]))))))) !=
        0xa646c726f777272 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x7265206f6c6c6568) goto LAB_0016a977;
    pcStackY_880 = (code *)0x16a877;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&uStack_860,uVar3,&uStack_870,1,0,(uv_fs_cb)0x0);
    if (iVar2 < 0xc) goto LAB_0016a97c;
    unaff_R14 = (uv_process_options_t *)&uStack_860;
    pcStackY_880 = (code *)0x16a88d;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    pcStackY_880 = (code *)0x16a89b;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar3,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0016a981;
    pcStackY_880 = (code *)0x16a8ad;
    uv_fs_req_cleanup(&uStack_860);
    pcStackY_880 = (code *)0x16a8c2;
    printf("output is: %s",output);
    if (CONCAT13(output[0xb],CONCAT12(output[10],CONCAT11(output[9],output[8]))) != 0xa646c72 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x6f77206f6c6c6568) goto LAB_0016a986;
    pcStackY_880 = (code *)0x16a8f5;
    unlink("stdout_file");
    pcStackY_880 = (code *)0x16a901;
    unlink("stderr_file");
    pcStackY_880 = (code *)0x16a906;
    pcVar7 = (char *)uv_default_loop();
    pcStackY_880 = (code *)0x16a91a;
    uv_walk((uv_loop_t *)pcVar7,close_walk_cb,(void *)0x0);
    pcStackY_880 = (code *)0x16a924;
    uv_run((uv_loop_t *)pcVar7,UV_RUN_DEFAULT);
    pcStackY_880 = (code *)0x16a929;
    puVar4 = uv_default_loop();
    pcStackY_880 = (code *)0x16a931;
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return;
    }
  }
  pcStackY_880 = run_test_spawn_stdin;
  run_test_spawn_stdout_and_stderr_to_file_swap_cold_11();
  loop = (uv_loop_t *)&pvStackY_bb0;
  pvStackY_bb0 = (void *)0x72662d6f6c6c6568;
  auStackY_ba8._0_7_ = 0x776170732d6d6f;
  auStackY_ba8[7] = 'n';
  auStackY_ba8._8_7_ = 0x6e696474735f;
  pcStackY_bb8 = (code *)0x16a9c9;
  puStackY_890 = (uv_loop_t *)pcVar7;
  puStackY_888 = (uv_fs_t *)unaff_R14;
  pcStackY_880 = (code *)unaff_R15;
  init_process_options("spawn_helper3",exit_cb);
  pcStackY_bb8 = (code *)0x16a9ce;
  puVar5 = uv_default_loop();
  puVar4 = (uv_loop_t *)&(&uStackY_b60)[1].type;
  pcStackY_bb8 = (code *)0x16a9e3;
  uv_pipe_init(puVar5,(uv_pipe_t *)puVar4,0);
  pcStackY_bb8 = (code *)0x16a9e8;
  puVar5 = uv_default_loop();
  pcStackY_bb8 = (code *)0x16a9fa;
  uv_pipe_init(puVar5,(uv_pipe_t *)&uStackY_b60,0);
  options.stdio = &uStackY_b80;
  uStackY_b80.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  iStackY_b70 = 0x21;
  options.stdio_count = 2;
  pcStackY_bb8 = (code *)0x16aa31;
  uStackY_b80.data.stream = &uStackY_b60;
  puStackY_b68 = (uv_handle_type *)puVar4;
  puVar5 = uv_default_loop();
  iVar8 = 0x333640;
  pcStackY_bb8 = (code *)0x16aa43;
  iVar2 = uv_spawn(puVar5,&process,&options);
  if (iVar2 == 0) {
    auStackY_ba8._32_8_ = (void *)0x17;
    puVar5 = (uv_loop_t *)(auStackY_a58 + 0x42);
    handle = &uStackY_b60;
    pcStackY_bb8 = (code *)0x16aa7c;
    auStackY_ba8._24_8_ = &pvStackY_bb0;
    iVar2 = uv_write((uv_write_t *)puVar5,handle,(uv_buf_t *)(auStackY_ba8 + 0x18),1,write_cb);
    iVar8 = (int)handle;
    if (iVar2 != 0) goto LAB_0016ab27;
    iVar8 = 0x169fb9;
    puVar5 = (uv_loop_t *)&(&uStackY_b60)[1].type;
    pcStackY_bb8 = (code *)0x16aa9f;
    iVar2 = uv_read_start((uv_stream_t *)puVar5,on_alloc,on_read);
    if (iVar2 != 0) goto LAB_0016ab2c;
    pcStackY_bb8 = (code *)0x16aaac;
    puVar5 = uv_default_loop();
    iVar8 = 0;
    pcStackY_bb8 = (code *)0x16aab6;
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016ab31;
    if (exit_cb_called != 1) goto LAB_0016ab36;
    if (close_cb_called != 3) goto LAB_0016ab3b;
    iVar8 = 0x3336d0;
    pcStackY_bb8 = (code *)0x16aadb;
    iVar2 = strcmp((char *)&pvStackY_bb0,output);
    if (iVar2 != 0) goto LAB_0016ab40;
    pcStackY_bb8 = (code *)0x16aae4;
    puVar4 = uv_default_loop();
    pcStackY_bb8 = (code *)0x16aaf8;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    iVar8 = 0;
    pcStackY_bb8 = (code *)0x16ab02;
    uv_run(puVar4,UV_RUN_DEFAULT);
    pcStackY_bb8 = (code *)0x16ab07;
    loop = uv_default_loop();
    pcStackY_bb8 = (code *)0x16ab0f;
    iVar2 = uv_loop_close(loop);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    pcStackY_bb8 = (code *)0x16ab27;
    run_test_spawn_stdin_cold_1();
LAB_0016ab27:
    pcStackY_bb8 = (code *)0x16ab2c;
    run_test_spawn_stdin_cold_2();
LAB_0016ab2c:
    pcStackY_bb8 = (code *)0x16ab31;
    run_test_spawn_stdin_cold_3();
LAB_0016ab31:
    pcStackY_bb8 = (code *)0x16ab36;
    run_test_spawn_stdin_cold_4();
LAB_0016ab36:
    pcStackY_bb8 = (code *)0x16ab3b;
    run_test_spawn_stdin_cold_5();
LAB_0016ab3b:
    loop = puVar5;
    pcStackY_bb8 = (code *)0x16ab40;
    run_test_spawn_stdin_cold_6();
LAB_0016ab40:
    pcStackY_bb8 = (code *)0x16ab45;
    run_test_spawn_stdin_cold_7();
  }
  pcStackY_bb8 = write_cb;
  run_test_spawn_stdin_cold_8();
  if (iVar8 == 0) {
    uv_close((uv_handle_t *)loop->pending_queue[1],close_cb);
    return;
  }
  pcStackY_bc0 = run_test_spawn_stdio_greater_than_3;
  write_cb_cold_1();
  uStackY_e18.queued_fds = (void *)0x16ab82;
  auStackY_cd8._264_8_ = puVar4;
  aStackY_bc8.stream = &uStackY_b60;
  pcStackY_bc0 = (code *)unaff_RBP;
  init_process_options("spawn_helper5",exit_cb);
  uStackY_e18.queued_fds = (void *)0x16ab87;
  puVar5 = uv_default_loop();
  puVar4 = (uv_loop_t *)auStackY_cd8;
  uStackY_e18.queued_fds = (void *)0x16ab9b;
  uv_pipe_init(puVar5,(uv_pipe_t *)puVar4,0);
  uStackY_d20.flags = UV_IGNORE;
  uStackY_d10 = 0;
  uStackY_d00 = 0;
  uStackY_cf0 = 0x21;
  options.stdio_count = 4;
  uStackY_e18.queued_fds = (void *)0x16abce;
  options.stdio = &uStackY_d20;
  puStackY_ce8 = puVar4;
  puVar5 = uv_default_loop();
  uStackY_e18.queued_fds = (void *)0x16abe0;
  iVar2 = uv_spawn(puVar5,&process,&options);
  if (iVar2 == 0) {
    uStackY_e18.queued_fds = (void *)0x16ac00;
    iVar2 = uv_read_start((uv_stream_t *)auStackY_cd8,on_alloc,on_read);
    if (iVar2 != 0) goto LAB_0016acbc;
    uStackY_e18.queued_fds = (void *)0x16ac0d;
    puVar5 = uv_default_loop();
    uStackY_e18.queued_fds = (void *)0x16ac17;
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016acc1;
    if (exit_cb_called != 1) goto LAB_0016acc6;
    if (close_cb_called != 2) goto LAB_0016accb;
    uStackY_e18.queued_fds = (void *)0x16ac4e;
    printf("output from stdio[3] is: %s",output);
    if (CONCAT17(output[0xe],
                 CONCAT16(output[0xd],
                          CONCAT15(output[0xc],
                                   CONCAT14(output[0xb],
                                            CONCAT13(output[10],
                                                     CONCAT12(output[9],
                                                              CONCAT11(output[8],output[7]))))))) !=
        0xa216f69647473 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x7320687472756f66) goto LAB_0016acd0;
    uStackY_e18.queued_fds = (void *)0x16ac7a;
    puVar4 = uv_default_loop();
    uStackY_e18.queued_fds = (void *)0x16ac8e;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uStackY_e18.queued_fds = (void *)0x16ac98;
    uv_run(puVar4,UV_RUN_DEFAULT);
    uStackY_e18.queued_fds = (void *)0x16ac9d;
    puVar5 = uv_default_loop();
    uStackY_e18.queued_fds = (void *)0x16aca5;
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    uStackY_e18.queued_fds = (void *)0x16acbc;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_0016acbc:
    uStackY_e18.queued_fds = (void *)0x16acc1;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_0016acc1:
    uStackY_e18.queued_fds = (void *)0x16acc6;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_0016acc6:
    uStackY_e18.queued_fds = (void *)0x16accb;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_0016accb:
    uStackY_e18.queued_fds = (void *)0x16acd0;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_0016acd0:
    uStackY_e18.queued_fds = (void *)0x16acd5;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  uStackY_e18.queued_fds = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  puStackY_e20 = (uv_loop_t *)0x16ace6;
  puVar5 = uv_default_loop();
  puStackY_e20 = (uv_loop_t *)0x16acf1;
  iVar2 = uv_tcp_init(puVar5,&uStackY_e18);
  if (iVar2 == 0) {
    puStackY_e20 = (uv_loop_t *)0x16ad02;
    iVar2 = uv_tcp_open(&uStackY_e18,3);
    if (iVar2 != 0) goto LAB_0016ad2b;
    puStackY_e20 = (uv_loop_t *)0x16ad15;
    iVar2 = uv_listen((uv_stream_t *)&uStackY_e18,0x1000,(uv_connection_cb)0x0);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    puStackY_e20 = (uv_loop_t *)0x16ad2b;
    spawn_tcp_server_helper_cold_1();
LAB_0016ad2b:
    puStackY_e20 = (uv_loop_t *)0x16ad30;
    spawn_tcp_server_helper_cold_2();
  }
  puStackY_e20 = (uv_loop_t *)run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  puStackY_e20 = puVar4;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStackY_e70);
  if (iVar2 == 0) {
    uStackY_e74 = -1;
    puVar4 = uv_default_loop();
    iVar2 = uv_tcp_init_ex(puVar4,&tcp_server,2);
    if (iVar2 != 0) goto LAB_0016ae96;
    iVar2 = uv_tcp_bind(&tcp_server,(sockaddr *)&sStackY_e70,0);
    if (iVar2 != 0) goto LAB_0016ae9b;
    iVar2 = uv_fileno((uv_handle_t *)&tcp_server,&uStackY_e74);
    if (iVar2 != 0) goto LAB_0016aea0;
    if (uStackY_e74 < 1) goto LAB_0016aea5;
    options.stdio = &uStackY_e60;
    uStackY_e60.flags = UV_INHERIT_FD;
    uStackY_e60.data.fd = 0;
    uStackY_e50 = 2;
    uStackY_e48 = 1;
    uStackY_e40 = 2;
    uStackY_e38 = 2;
    uStackY_e30 = 2;
    iStackY_e28 = uStackY_e74;
    options.stdio_count = 4;
    puVar4 = uv_default_loop();
    iVar2 = uv_spawn(puVar4,&process,&options);
    if (iVar2 != 0) goto LAB_0016aeaa;
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016aeaf;
    if (exit_cb_called != 1) goto LAB_0016aeb4;
    if (close_cb_called != 1) goto LAB_0016aeb9;
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    run_test_spawn_tcp_server_cold_1();
LAB_0016ae96:
    run_test_spawn_tcp_server_cold_2();
LAB_0016ae9b:
    run_test_spawn_tcp_server_cold_3();
LAB_0016aea0:
    run_test_spawn_tcp_server_cold_4();
LAB_0016aea5:
    run_test_spawn_tcp_server_cold_5();
LAB_0016aeaa:
    run_test_spawn_tcp_server_cold_6();
LAB_0016aeaf:
    run_test_spawn_tcp_server_cold_7();
LAB_0016aeb4:
    run_test_spawn_tcp_server_cold_8();
LAB_0016aeb9:
    run_test_spawn_tcp_server_cold_9();
  }
  run_test_spawn_tcp_server_cold_10();
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  options.stdio_count = 0;
  puVar4 = uv_default_loop();
  iVar2 = uv_spawn(puVar4,&process,&options);
  if (iVar2 == 0) {
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016af70;
    if (exit_cb_called != 1) goto LAB_0016af75;
    if (close_cb_called != 1) goto LAB_0016af7a;
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    run_test_spawn_ignored_stdio_cold_1();
LAB_0016af70:
    run_test_spawn_ignored_stdio_cold_2();
LAB_0016af75:
    run_test_spawn_ignored_stdio_cold_3();
LAB_0016af7a:
    run_test_spawn_ignored_stdio_cold_4();
  }
  run_test_spawn_ignored_stdio_cold_5();
  init_process_options("spawn_helper4",kill_cb);
  loop_00 = (uv_timer_t *)uv_default_loop();
  puVar9 = &process;
  iVar2 = uv_spawn((uv_loop_t *)loop_00,&process,&options);
  if (iVar2 == 0) {
    loop_00 = (uv_timer_t *)uv_default_loop();
    puVar10 = &timer;
    iVar2 = uv_timer_init((uv_loop_t *)loop_00,&timer);
    pcVar11 = (code *)puVar10;
    if (iVar2 != 0) goto LAB_0016b057;
    loop_00 = &timer;
    pcVar11 = timer_cb;
    iVar2 = uv_timer_start(&timer,timer_cb,500,0);
    if (iVar2 != 0) goto LAB_0016b05c;
    loop_00 = (uv_timer_t *)uv_default_loop();
    pcVar11 = (code *)0x0;
    iVar2 = uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0016b061;
    if (exit_cb_called != 1) goto LAB_0016b066;
    if (close_cb_called != 2) goto LAB_0016b06b;
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    pcVar11 = (code *)0x0;
    uv_run(puVar4,UV_RUN_DEFAULT);
    loop_00 = (uv_timer_t *)uv_default_loop();
    iVar2 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    run_test_spawn_and_kill_cold_1();
    pcVar11 = (code *)puVar9;
LAB_0016b057:
    run_test_spawn_and_kill_cold_2();
LAB_0016b05c:
    run_test_spawn_and_kill_cold_3();
LAB_0016b061:
    run_test_spawn_and_kill_cold_4();
LAB_0016b066:
    run_test_spawn_and_kill_cold_5();
LAB_0016b06b:
    run_test_spawn_and_kill_cold_6();
  }
  run_test_spawn_and_kill_cold_7();
  pcVar6 = "exit_cb";
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if ((uv_timer_t *)pcVar11 == (uv_timer_t *)0x0) {
    if (extraout_EDX == 0xf) {
      uv_close((uv_handle_t *)loop_00,close_cb);
      pcVar6 = (char *)(ulong)*(uint *)&((uv_loop_t *)loop_00)->watchers;
      iVar2 = uv_kill(*(uint *)&((uv_loop_t *)loop_00)->watchers,0);
      if (iVar2 == -3) {
        return;
      }
      goto LAB_0016b0ca;
    }
  }
  else {
    kill_cb_cold_1();
  }
  kill_cb_cold_2();
LAB_0016b0ca:
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  uv_close((uv_handle_t *)pcVar6,close_cb);
  return;
}

Assistant:

static void on_read(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* rdbuf) {
  uv_write_t* req;
  uv_buf_t wrbuf;
  int r;

  ASSERT(nread > 0 || nread == UV_EOF);

  if (nread > 0) {
    output_used += nread;
    if (output_used == 12) {
      ASSERT(memcmp("hello world\n", output, 12) == 0);
      wrbuf = uv_buf_init(output, output_used);
      req = malloc(sizeof(*req));
      r = uv_write(req, (uv_stream_t*)&in, &wrbuf, 1, after_write);
      ASSERT(r == 0);
    }
  }

  on_read_cb_called++;
}